

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sfc::Image::Image(Image *this,string *path)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *prVar7;
  char *pcVar8;
  byte bVar9;
  pointer puVar10;
  bool bVar11;
  uint h;
  uint w;
  rgba_vec_t rgba_v;
  byte_vec_t buffer;
  uint32_t color;
  State state;
  uint local_2d0;
  uint local_2cc;
  channel_vec_t *local_2c8;
  index_vec_t *local_2c0;
  rgba_set_t *local_2b8;
  rgba_vec_t local_2b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_280;
  State local_250;
  
  local_2c8 = &this->_data;
  local_2c0 = &this->_indexed_data;
  local_2b8 = &this->_colors;
  p_Var1 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = lodepng::load_file(&local_298,path);
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lodepng::State::State(&local_250);
  local_250.super_LodePNGState.decoder.color_convert = 0;
  local_250.super_LodePNGState.decoder.ignore_crc = 1;
  uVar4 = lodepng::decode(local_2c8,&local_2cc,&local_2d0,&local_250,&local_298);
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar11 = local_250.super_LodePNGState.info_raw.colortype == LCT_PALETTE;
  if (bVar11) {
    if (local_250.super_LodePNGState.info_raw.bitdepth - 1 < 7) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_280,
                 (ulong)(local_2d0 * local_2cc),(allocator_type *)&local_2b0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (local_2c0,&local_280);
      pvVar3 = (void *)CONCAT44(local_280._M_impl._4_4_,local_280._M_impl._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_280._M_impl.super__Rb_tree_header._M_header._M_parent -
                               (long)pvVar3);
      }
      iVar5 = local_250.super_LodePNGState.info_raw.bitdepth +
              (local_250.super_LodePNGState.info_raw.bitdepth == 0);
      bVar9 = 0;
      do {
        bVar9 = bVar9 * '\x02' + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar5 = 0;
      puVar10 = (this->_indexed_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar10) {
        uVar6 = 0;
        do {
          puVar10[uVar6] =
               (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start
               [uVar6 / (8 / (ulong)local_250.super_LodePNGState.info_raw.bitdepth)] >>
               (8 - (((byte)iVar5 & 7) + (char)local_250.super_LodePNGState.info_raw.bitdepth) &
               0x1f) & bVar9;
          puVar10 = (this->_indexed_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (ulong)((int)uVar6 + 1);
          iVar5 = iVar5 + local_250.super_LodePNGState.info_raw.bitdepth;
        } while (uVar6 < (ulong)((long)(this->_indexed_data).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10));
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_2c0,local_2c8);
    }
    if ((local_250.super_LodePNGState.info_raw.palettesize & 0x3fffffffffffffff) != 0) {
      uVar4 = 4;
      uVar6 = 0;
      do {
        local_280._M_impl._0_4_ =
             CONCAT13(local_250.super_LodePNGState.info_raw.palette[uVar4 - 1],
                      CONCAT12(local_250.super_LodePNGState.info_raw.palette[uVar4 - 2],
                               CONCAT11(local_250.super_LodePNGState.info_raw.palette[uVar4 - 3],
                                        local_250.super_LodePNGState.info_raw.palette[uVar6])));
        __position._M_current =
             (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_palette,__position
                     ,(uint *)&local_280);
        }
        else {
          *__position._M_current = local_280._M_impl._0_4_;
          (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 4;
      } while (uVar6 < local_250.super_LodePNGState.info_raw.palettesize << 2);
    }
    local_250.super_LodePNGState.info_raw.colortype = LCT_RGBA;
  }
  if ((local_250.super_LodePNGState.info_png.color.colortype < 5) &&
     ((0x15U >> (local_250.super_LodePNGState.info_png.color.colortype & 0x1f) & 1) != 0)) {
    local_250.super_LodePNGState.info_raw.colortype = LCT_RGBA;
    bVar11 = true;
  }
  if (local_250.super_LodePNGState.info_png.color.bitdepth == 8) {
    if (!bVar11) goto LAB_0013860b;
  }
  else {
    local_250.super_LodePNGState.info_raw.bitdepth = 8;
  }
  puVar10 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar10) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar10;
  }
  local_250.super_LodePNGState.decoder.color_convert = 1;
  uVar4 = lodepng::decode(local_2c8,&local_2cc,&local_2d0,&local_250,&local_298);
  if (uVar4 != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar8 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar7,pcVar8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0013860b:
  this->_width = local_2cc;
  this->_height = local_2d0;
  this->_src_coord_x = 0;
  this->_src_coord_y = 0;
  to_rgba(&local_2b0,local_2c8);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_280,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&local_2b8->_M_t);
  if (local_280._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_280._M_impl.super__Rb_tree_header;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_280._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_280._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_280._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_280._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_280._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_280._M_impl.super__Rb_tree_header._M_node_count;
    local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_280._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_280._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_280);
  if (local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lodepng::State::~State(&local_250);
  if (local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Image::Image(const std::string& path) {
  byte_vec_t buffer;
  unsigned w, h;

  unsigned error = lodepng::load_file(buffer, path);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  lodepng::State state;
  state.decoder.color_convert = false;
  state.decoder.ignore_crc = true;

  error = lodepng::decode(_data, w, h, state, buffer);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  bool needs_conversion = false;

  if (state.info_raw.colortype == LCT_PALETTE) {
    if (state.info_raw.bitdepth && state.info_raw.bitdepth < 8) {
      // unpack 2/4 bit data
      _indexed_data = index_vec_t(w * h);
      unsigned depth = state.info_raw.bitdepth;
      unsigned ppb = 8 / state.info_raw.bitdepth;
      index_t mask = 0;
      for (unsigned i = 0; i < depth; ++i)
        mask = (mask << 1) + 1;

      for (unsigned i = 0; i < _indexed_data.size(); ++i) {
        unsigned pack_shift = 8 - depth - ((i * depth) % 8);
        _indexed_data[i] = mask & (_data[i / ppb] >> pack_shift);
      }

    } else {
      _indexed_data = _data;
    }

    for (unsigned i = 0; i < state.info_raw.palettesize * 4; i += 4) {
      uint32_t color = (state.info_raw.palette[i]) + (state.info_raw.palette[i + 1] << 8) +
                       (state.info_raw.palette[i + 2] << 16) + (state.info_raw.palette[i + 3] << 24);
      _palette.push_back(color);
    }

    needs_conversion = true;
    state.info_raw.colortype = LCT_RGBA;
  }

  if (state.info_png.color.colortype == LCT_RGB || state.info_png.color.colortype == LCT_GREY ||
      state.info_png.color.colortype == LCT_GREY_ALPHA) {
    state.info_raw.colortype = LCT_RGBA;
    needs_conversion = true;
  }

  if (state.info_png.color.bitdepth != 8) {
    state.info_raw.bitdepth = 8;
    needs_conversion = true;
  }

  if (needs_conversion) {
    _data.clear();
    state.decoder.color_convert = true;
    error = lodepng::decode(_data, w, h, state, buffer);
    if (error)
      throw std::runtime_error(lodepng_error_text(error));
  }

  _width = w;
  _height = h;

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}